

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O3

Cut_Man_t * Cut_ManStart(Cut_Params_t *pParams)

{
  bool bVar1;
  bool bVar2;
  Cut_Man_t *pCVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int *piVar11;
  Extra_MmFixed_t *pEVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  int nEntrySize;
  int iVar17;
  uint uVar18;
  
  iVar15 = pParams->nVarsMax;
  if (9 < iVar15 - 3U) {
    __assert_fail("pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutMan.c"
                  ,0x34,"Cut_Man_t *Cut_ManStart(Cut_Params_t *)");
  }
  pCVar3 = (Cut_Man_t *)calloc(1,0x140);
  pCVar3->pParams = pParams;
  uVar13 = pParams->nIdsMax;
  uVar7 = (ulong)uVar13;
  lVar14 = (long)(int)uVar13;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar18 = 8;
  if (6 < uVar13 - 1) {
    uVar18 = uVar13;
  }
  pVVar4->nCap = uVar18;
  if (uVar18 == 0) {
    pVVar4->pArray = (void **)0x0;
    pCVar3->vCutsNew = pVVar4;
    if (0 < (int)uVar13) {
      sVar16 = uVar7 * 8;
LAB_00450a74:
      ppvVar5 = (void **)malloc(sVar16);
      goto LAB_00450a7c;
    }
    bVar2 = false;
    bVar1 = false;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar18 * 8);
    pVVar4->pArray = ppvVar5;
    pCVar3->vCutsNew = pVVar4;
    if ((int)uVar18 < (int)uVar13) {
      sVar16 = lVar14 * 8;
      if (ppvVar5 == (void **)0x0) goto LAB_00450a74;
      ppvVar5 = (void **)realloc(ppvVar5,sVar16);
LAB_00450a7c:
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = uVar13;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if ((int)uVar13 < 1) {
      bVar2 = false;
    }
    else {
      uVar6 = 0;
      do {
        pVVar4->pArray[uVar6] = (void *)0x0;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      bVar2 = true;
    }
  }
  pVVar4->nSize = uVar13;
  if (pParams->fSeq == 0) goto LAB_00450c5c;
  pParams->fFilter = 1;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = uVar18;
  if (uVar18 == 0) {
    pVVar4->pArray = (void **)0x0;
    pCVar3->vCutsOld = pVVar4;
    if (bVar1) {
LAB_00450b42:
      ppvVar5 = (void **)malloc(lVar14 << 3);
      goto LAB_00450b4a;
    }
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar18 << 3);
    pVVar4->pArray = ppvVar5;
    pCVar3->vCutsOld = pVVar4;
    if (bVar1) {
      if (ppvVar5 == (void **)0x0) goto LAB_00450b42;
      ppvVar5 = (void **)realloc(ppvVar5,lVar14 << 3);
LAB_00450b4a:
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = uVar13;
    }
  }
  if (bVar2) {
    uVar6 = 0;
    do {
      pVVar4->pArray[uVar6] = (void *)0x0;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  pVVar4->nSize = uVar13;
  uVar13 = pParams->nCutSet;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar18 = 8;
  if (6 < uVar13 - 1) {
    uVar18 = uVar13;
  }
  pVVar4->nCap = uVar18;
  if (uVar18 == 0) {
    pVVar4->pArray = (void **)0x0;
    pCVar3->vCutsTemp = pVVar4;
    if (0 < (int)uVar13) {
      sVar16 = (ulong)uVar13 * 8;
LAB_00450c0b:
      ppvVar5 = (void **)malloc(sVar16);
      goto LAB_00450c13;
    }
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar18 << 3);
    pVVar4->pArray = ppvVar5;
    pCVar3->vCutsTemp = pVVar4;
    if ((int)uVar18 < (int)uVar13) {
      sVar16 = (long)(int)uVar13 << 3;
      if (ppvVar5 == (void **)0x0) goto LAB_00450c0b;
      ppvVar5 = (void **)realloc(ppvVar5,sVar16);
LAB_00450c13:
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = uVar13;
    }
    if (0 < (int)uVar13) {
      uVar7 = 0;
      do {
        pVVar4->pArray[uVar7] = (void *)0x0;
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
  }
  pVVar4->nSize = uVar13;
  if ((5 < iVar15) && (pParams->fTruth != 0)) {
    pParams->fTruth = 0;
    puts("Skipping computation of truth tables for sequential cuts with more than 5 inputs.");
    iVar15 = pParams->nVarsMax;
  }
LAB_00450c5c:
  nEntrySize = iVar15 * 4 + 0x18;
  pCVar3->EntrySize = nEntrySize;
  if (pParams->fTruth != 0) {
    if (iVar15 < 0xf) {
      uVar13 = 1 << ((char)iVar15 - 5U & 0x1f);
      if (iVar15 < 6) {
        uVar13 = 1;
      }
      pCVar3->nTruthWords = uVar13;
      nEntrySize = (iVar15 + uVar13) * 4 + 0x18;
      pCVar3->EntrySize = nEntrySize;
    }
    else {
      pParams->fTruth = 0;
      uVar13 = 0;
      printf("Skipping computation of truth table for more than %d inputs.\n");
    }
    puVar8 = (uint *)malloc((ulong)(uVar13 * 4) << 2);
    pCVar3->puTemp[0] = puVar8;
    puVar8 = puVar8 + uVar13;
    pCVar3->puTemp[1] = puVar8;
    pCVar3->puTemp[2] = puVar8 + uVar13;
    pCVar3->puTemp[3] = puVar8 + uVar13 + uVar13;
  }
  if (pParams->fRecord != 0) {
    iVar15 = pParams->nIdsMax;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    iVar17 = 0x10;
    if (0xe < iVar15 - 1U) {
      iVar17 = iVar15;
    }
    pVVar9->nCap = iVar17;
    if (iVar17 == 0) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = (int *)malloc((long)iVar17 * 4);
    }
    pVVar9->pArray = piVar10;
    pVVar9->nSize = iVar15;
    piVar11 = (int *)0x0;
    memset(piVar10,0,(long)iVar15 << 2);
    pCVar3->vNodeCuts = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = iVar17;
    if (iVar17 != 0) {
      piVar11 = (int *)malloc((long)iVar17 << 2);
    }
    pVVar9->pArray = piVar11;
    pVVar9->nSize = iVar15;
    memset(piVar11,0,(long)iVar15 << 2);
    pCVar3->vNodeStarts = pVVar9;
    pVVar9 = (Vec_Int_t *)calloc(1,0x10);
    pCVar3->vCutPairs = pVVar9;
  }
  if ((pParams->fMap != 0) && (pParams->fSeq == 0)) {
    iVar15 = pParams->nIdsMax;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    iVar17 = 0x10;
    if (0xe < iVar15 - 1U) {
      iVar17 = iVar15;
    }
    pVVar9->nCap = iVar17;
    if (iVar17 == 0) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = (int *)malloc((long)iVar17 * 4);
    }
    pVVar9->pArray = piVar10;
    pVVar9->nSize = iVar15;
    sVar16 = (long)iVar15 * 4;
    piVar11 = (int *)0x0;
    memset(piVar10,0,sVar16);
    pCVar3->vDelays = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = iVar17;
    if (iVar17 != 0) {
      piVar11 = (int *)malloc((long)iVar17 << 2);
    }
    pVVar9->pArray = piVar11;
    pVVar9->nSize = iVar15;
    ppvVar5 = (void **)0x0;
    memset(piVar11,0,sVar16);
    pCVar3->vDelays2 = pVVar9;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    iVar17 = 8;
    if (6 < iVar15 - 1U) {
      iVar17 = iVar15;
    }
    pVVar4->nCap = iVar17;
    if (iVar17 != 0) {
      ppvVar5 = (void **)malloc((long)iVar17 << 3);
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nSize = iVar15;
    memset(ppvVar5,0,(long)iVar15 << 3);
    pCVar3->vCutsMax = pVVar4;
  }
  pEVar12 = Extra_MmFixedStart(nEntrySize);
  pCVar3->pMmCuts = pEVar12;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pCVar3->vTemp = pVVar4;
  return pCVar3;
}

Assistant:

Cut_Man_t * Cut_ManStart( Cut_Params_t * pParams )
{
    Cut_Man_t * p;
//    extern int nTruthDsd;
//    nTruthDsd = 0;
    assert( pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX );
    p = ABC_ALLOC( Cut_Man_t, 1 );
    memset( p, 0, sizeof(Cut_Man_t) );
    // set and correct parameters
    p->pParams = pParams;
    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, pParams->nIdsMax, NULL );
    // prepare storage for sequential cuts
    if ( pParams->fSeq )
    {
        p->pParams->fFilter = 1;
        p->vCutsOld = Vec_PtrAlloc( pParams->nIdsMax );
        Vec_PtrFill( p->vCutsOld, pParams->nIdsMax, NULL );
        p->vCutsTemp = Vec_PtrAlloc( pParams->nCutSet );
        Vec_PtrFill( p->vCutsTemp, pParams->nCutSet, NULL );
        if ( pParams->fTruth && pParams->nVarsMax > 5 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth tables for sequential cuts with more than 5 inputs.\n" );
        }
    }
    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + pParams->nVarsMax * sizeof(int);
    if ( pParams->fTruth )
    {
        if ( pParams->nVarsMax > 14 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than %d inputs.\n", 14 );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    // enable cut computation recording
    if ( pParams->fRecord )
    {
        p->vNodeCuts   = Vec_IntStart( pParams->nIdsMax );
        p->vNodeStarts = Vec_IntStart( pParams->nIdsMax );
        p->vCutPairs   = Vec_IntAlloc( 0 );
    }
    // allocate storage for delays
    if ( pParams->fMap && !p->pParams->fSeq )
    {
        p->vDelays = Vec_IntStart( pParams->nIdsMax );
        p->vDelays2 = Vec_IntStart( pParams->nIdsMax );
        p->vCutsMax = Vec_PtrStart( pParams->nIdsMax );
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    p->vTemp = Vec_PtrAlloc( 100 );
    return p;
}